

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O1

Sections __thiscall QFileSystemTreeView::visibleSections(QFileSystemTreeView *this)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  
  QTreeView::header();
  iVar4 = QHeaderView::hiddenSectionCount();
  if (iVar4 < 1) {
    uVar5 = 0;
  }
  else {
    iVar4 = QTreeView::header();
    bVar2 = QHeaderView::isSectionHidden(iVar4);
    iVar4 = QTreeView::header();
    cVar3 = QHeaderView::isSectionHidden(iVar4);
    uVar5 = (bVar2 ^ 1) + 2;
    if (cVar3 != '\0') {
      uVar5 = (uint)(bVar2 ^ 1);
    }
    iVar4 = QTreeView::header();
    cVar3 = QHeaderView::isSectionHidden(iVar4);
    uVar1 = uVar5 + 4;
    if (cVar3 != '\0') {
      uVar1 = uVar5;
    }
    iVar4 = QTreeView::header();
    cVar3 = QHeaderView::isSectionHidden(iVar4);
    uVar5 = uVar1 | 8;
    if (cVar3 != '\0') {
      uVar5 = uVar1;
    }
  }
  return (Sections)uVar5;
}

Assistant:

QFileSystemTreeView::Sections QFileSystemTreeView::visibleSections() const {
    const auto isSectionHidden = [this](QFileSystemTreeView::Column column) {
        return header()->isSectionHidden(static_cast<int>(column));
    };
    QFileSystemTreeView::Sections sections = QFileSystemTreeView::Section::All;

    if (header()->hiddenSectionCount() > 0) {
        if (!isSectionHidden(QFileSystemTreeView::Column::Name)) {
            sections |= QFileSystemTreeView::Section::Name;
        }

        if (!isSectionHidden(QFileSystemTreeView::Column::Size)) {
            sections |= QFileSystemTreeView::Section::Size;
        }

        if (!isSectionHidden(QFileSystemTreeView::Column::Type)) {
            sections |= QFileSystemTreeView::Section::Type;
        }

        if (!isSectionHidden(QFileSystemTreeView::Column::LastModification)) {
            sections |= QFileSystemTreeView::Section::LastModification;
        }
    }

    return sections;
}